

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxUnicode.cpp
# Opt level: O2

String * Jinx::Impl::ConvertUtf16ToUtf8(String *__return_storage_ptr__,StringU16 *utf16_string)

{
  pointer pcVar1;
  size_type __res;
  size_t sVar2;
  char16_t *utf16In;
  char32_t utf32CodePoint;
  char outBuffer [5];
  size_t numOut;
  
  pcVar1 = (utf16_string->_M_dataplus)._M_p;
  __res = utf16_string->_M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::reserve
            (__return_storage_ptr__,__res);
  utf32CodePoint = L'\0';
  numOut = 0;
  utf16In = pcVar1;
  while (*utf16In != L'\0') {
    ConvertUtf16ToUtf32(utf16In,(uint32_t)((long)pcVar1 + (__res * 2 - (long)utf16In) >> 1),
                        &utf32CodePoint,&numOut);
    sVar2 = numOut;
    ConvertUtf32ToUtf8(utf32CodePoint,outBuffer,5,&numOut);
    utf16In = utf16In + sVar2;
    outBuffer[numOut] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
              (__return_storage_ptr__,outBuffer);
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t String ConvertUtf16ToUtf8(const StringU16 & utf16_string)
	{
		const char16_t * cInStr = utf16_string.c_str();
		const char16_t * cInStrEnd = cInStr + utf16_string.size();
		String outString;
		outString.reserve(utf16_string.size());
		char outBuffer[5];
		char32_t utf32CodePoint = 0;
		size_t numOut = 0;
		while (*cInStr != 0)
		{
			Impl::ConvertUtf16ToUtf32(cInStr, (uint32_t)(cInStrEnd - cInStr), &utf32CodePoint, &numOut);
			cInStr += numOut;
			Impl::ConvertUtf32ToUtf8(utf32CodePoint, outBuffer, std::size(outBuffer), &numOut);
			outBuffer[numOut] = 0;
			outString += outBuffer;
		}
		return outString;
	}